

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<float,unsigned_long>
          (BaseAppender *this,Vector *col,float input)

{
  bool bVar1;
  InvalidInputException *this_00;
  duckdb *this_01;
  unsigned_long result;
  uint64_t local_40;
  string local_38;
  
  this_01 = (duckdb *)0x0;
  bVar1 = TryCast::Operation<float,unsigned_long>(input,&local_40,false);
  if (bVar1) {
    *(uint64_t *)(col->data + (this->chunk).count * 8) = local_40;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<float,unsigned_long>(&local_38,this_01,input);
  InvalidInputException::InvalidInputException(this_00,&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}